

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::generateHeartbeat(Session *this)

{
  Message heartbeat;
  allocator<char> local_1d9;
  STRING local_1d8;
  FieldBase local_1b8;
  Message local_160;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"0",&local_1d9);
  MsgType::MsgType((MsgType *)&local_1b8,&local_1d8);
  newMessage(&local_160,this,(MsgType *)&local_1b8);
  FieldBase::~FieldBase(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  fill(this,&local_160.m_header);
  sendRaw(this,&local_160,0);
  Message::~Message(&local_160);
  return;
}

Assistant:

void Session::generateHeartbeat() {
  Message heartbeat = newMessage(MsgType(MsgType_Heartbeat));

  fill(heartbeat.getHeader());
  sendRaw(heartbeat);
}